

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O1

void duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLS::GenerateRandomDataStatic
               (data_ptr_t data,idx_t len)

{
  timestamp_t seed;
  size_t __n;
  uint32_t random_integer;
  RandomEngine random_engine;
  uint32_t local_5c;
  RandomEngine local_58;
  
  seed = duckdb::Timestamp::GetCurrentTimestamp();
  duckdb::RandomEngine::RandomEngine(&local_58,seed.value);
  if (len != 0) {
    do {
      local_5c = duckdb::RandomEngine::NextRandomInteger(&local_58);
      __n = 4;
      if (len < 4) {
        __n = len;
      }
      switchD_00b1522a::default(data,&local_5c,__n);
      data = data + __n;
      len = len - __n;
    } while (len != 0);
  }
  duckdb::RandomEngine::~RandomEngine(&local_58);
  return;
}

Assistant:

void MbedTlsWrapper::AESStateMBEDTLS::GenerateRandomDataStatic(duckdb::data_ptr_t data, duckdb::idx_t len) {
	duckdb::RandomEngine random_engine(duckdb::Timestamp::GetCurrentTimestamp().value);
	while (len != 0) {
		const auto random_integer = random_engine.NextRandomInteger();
		const auto next = duckdb::MinValue<duckdb::idx_t>(len, sizeof(random_integer));
		memcpy(data, duckdb::const_data_ptr_cast(&random_integer), next);
		data += next;
		len -= next;
	}
}